

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::writeTestFile
          (SonarQubeReporter *this,StringRef filename,
          vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
          *testCaseNodes)

{
  undefined8 this_00;
  bool bVar1;
  reference ppNVar2;
  StringRef name;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> **child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
  *__range1;
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  ScopedElement e;
  vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
  *testCaseNodes_local;
  SonarQubeReporter *this_local;
  StringRef filename_local;
  
  e._8_8_ = testCaseNodes;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"file",&local_59);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_38,(string *)&this->xml,(XmlFormatting)local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  name = operator____sr("path",4);
  XmlWriter::writeAttribute(&this->xml,name,filename);
  this_00 = e._8_8_;
  __end1 = std::
           vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
           ::begin((vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
                    *)e._8_8_);
  child = (Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> **)
          std::
          vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
          ::end((vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
                 *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*const_*,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>
                                *)&child);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*const_*,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>
              ::operator*(&__end1);
    writeTestCase(this,*ppNVar2);
    __gnu_cxx::
    __normal_iterator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*const_*,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>
    ::operator++(&__end1);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_38);
  return;
}

Assistant:

void SonarQubeReporter::writeTestFile(StringRef filename, std::vector<TestCaseNode const*> const& testCaseNodes) {
        XmlWriter::ScopedElement e = xml.scopedElement("file");
        xml.writeAttribute("path"_sr, filename);

        for (auto const& child : testCaseNodes)
            writeTestCase(*child);
    }